

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O1

string * __thiscall TileSwitch::toString_abi_cxx11_(string *__return_storage_ptr__,TileSwitch *this)

{
  pointer pcVar1;
  pointer pbVar2;
  long lVar3;
  
  pbVar2 = INPUT_SYMBOL_TABLE_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)*(int *)&(this->super_Tile).field_0x24;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = pbVar2[lVar3 + -1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar2[lVar3 + -1]._M_string_length);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TileSwitch::toString() const {
    string s(INPUT_SYMBOL_TABLE[_state - 1]);
    s.push_back(_charID);
    return s;
}